

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O1

bool __thiscall google::protobuf::io::CordInputStream::LoadChunkData(CordInputStream *this)

{
  size_t sVar1;
  
  if (this->bytes_remaining_ == 0) {
    this->size_ = 0;
    this->available_ = 0;
  }
  else {
    if ((this->it_).chunk_iterator_.bytes_remaining_ == 0) {
      LoadChunkData();
    }
    sVar1 = (this->it_).chunk_iterator_.current_chunk_._M_len;
    this->data_ = (this->it_).chunk_iterator_.current_chunk_._M_str;
    this->available_ = sVar1;
    this->size_ = sVar1;
  }
  return this->bytes_remaining_ != 0;
}

Assistant:

bool CordInputStream::LoadChunkData() {
  if (bytes_remaining_ != 0) {
    absl::string_view sv = absl::Cord::ChunkRemaining(it_);
    data_ = sv.data();
    size_ = available_ = sv.size();
    return true;
  }
  size_ = available_ = 0;
  return false;
}